

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

FloatVector *
google::protobuf::internal::GenericTypeHandler<CoreML::Specification::FloatVector>::New
          (Arena *arena)

{
  Arena *arena_local;
  FloatVector *local_28;
  FloatVector *t;
  
  if (arena == (Arena *)0x0) {
    local_28 = (FloatVector *)operator_new(0x28);
    CoreML::Specification::FloatVector::FloatVector(local_28);
  }
  else {
    local_28 = (FloatVector *)
               Arena::AllocateAligned
                         (arena,(type_info *)&CoreML::Specification::FloatVector::typeinfo,0x28);
    CoreML::Specification::FloatVector::FloatVector(local_28);
    Arena::AddListNode(arena,local_28,arena_destruct_object<CoreML::Specification::FloatVector>);
  }
  return local_28;
}

Assistant:

static inline GenericType* New(Arena* arena) {
    return ::google::protobuf::Arena::CreateMaybeMessage<Type>(
        arena, static_cast<GenericType*>(0));
  }